

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall
Refal2::CSetBuilder<unsigned_int>::ExcludeAllExcept(CSetBuilder<unsigned_int> *this,CSet *elements)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  insert_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  iVar6;
  undefined1 local_90 [8];
  CSet tmp;
  CSet *elements_local;
  CSetBuilder<unsigned_int> *this_local;
  
  if (this->fullSetStatus == S_Thru) {
    this->fullSetStatus = S_No;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (&this->thru,elements);
  }
  else {
    if (this->fullSetStatus == S_Yes) {
      iVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                        (&this->thru);
      iVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&this->thru);
      iVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                        (elements);
      iVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (elements);
      iVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&this->no);
      iVar6 = std::
              inserter<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                        (&this->no,iVar5);
      join_0x00000010_0x00000000_ =
           std::
           set_difference<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::insert_iterator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                     ((_Rb_tree_const_iterator<unsigned_int>)iVar1._M_node,
                      (_Rb_tree_const_iterator<unsigned_int>)iVar2._M_node,
                      (_Rb_tree_const_iterator<unsigned_int>)iVar3._M_node,
                      (_Rb_tree_const_iterator<unsigned_int>)iVar4._M_node,iVar6);
    }
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_90
              );
    iVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                      (&this->thru);
    iVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      (&this->thru);
    iVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                      (elements);
    iVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      (elements);
    iVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_90);
    iVar6 = std::
            inserter<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_90,iVar5);
    std::
    set_intersection<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::insert_iterator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
              ((_Rb_tree_const_iterator<unsigned_int>)iVar1._M_node,
               (_Rb_tree_const_iterator<unsigned_int>)iVar2._M_node,
               (_Rb_tree_const_iterator<unsigned_int>)iVar3._M_node,
               (_Rb_tree_const_iterator<unsigned_int>)iVar4._M_node,iVar6);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (&this->thru,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_90
              );
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_90
              );
  }
  return;
}

Assistant:

void CSetBuilder<T>::ExcludeAllExcept(const CSet& elements)
{
	/*
	IF full_set_status == S_thru THEN
		full_set_status = S_no
		THRU = elements
	ELSE IF full_set_status == S_yes THEN
		NO = NO + (THRU - elements)
		THRU = THRU * elements
	ELSE IF full_set_status == S_no THEN
		THRU = THRU * elements
	*/
	if( fullSetStatus == S_Thru ) {
		fullSetStatus = S_No;
		thru = elements;
	} else {
		if( fullSetStatus == S_Yes ) {
			std::set_difference( thru.begin(), thru.end(), elements.begin(),
				elements.end(), std::inserter( no, no.end() ) );
		}
		CSet tmp;
		std::set_intersection( thru.begin(), thru.end(), elements.begin(),
			elements.end(), std::inserter( tmp, tmp.end() ) );
		thru = tmp;
	}
}